

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  Dictionary::getSubwords
            ((vector<int,_std::allocator<int>_> *)&local_30,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  uVar2 = 0;
  while( true ) {
    uVar1 = (long)local_30._M_impl.super__Vector_impl_data._M_finish -
            (long)local_30._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar1 <= uVar2) break;
    addInputVector(this,vec,local_30._M_impl.super__Vector_impl_data._M_start[uVar2]);
    uVar2 = uVar2 + 1;
  }
  if (local_30._M_impl.super__Vector_impl_data._M_finish !=
      local_30._M_impl.super__Vector_impl_data._M_start) {
    Vector::mul(vec,(float)(1.0 / (double)(long)uVar1));
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int i = 0; i < ngrams.size(); i++) {
    addInputVector(vec, ngrams[i]);
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / ngrams.size());
  }
}